

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

PlayerStrategy * __thiscall PlayerStrategy::operator=(PlayerStrategy *this,PlayerStrategy *rhs)

{
  code *pcVar1;
  string *__return_storage_ptr__;
  PlayerStrategy *rhs_local;
  PlayerStrategy *this_local;
  
  this->exchangingCardType = rhs->exchangingCardType;
  this->armiesToPlace = rhs->armiesToPlace;
  this->player = rhs->player;
  this->from = rhs->from;
  this->to = rhs->to;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  getStrategyName_abi_cxx11_(__return_storage_ptr__,rhs);
  this->strategyName = __return_storage_ptr__;
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

PlayerStrategy& PlayerStrategy::operator=(const PlayerStrategy& rhs) {
    this->exchangingCardType = rhs.exchangingCardType;
    this->armiesToPlace = rhs.armiesToPlace;
    this->player = rhs.player;
    this->from = rhs.from;
    this->to = rhs.to;
    this->strategyName = new std::string(rhs.getStrategyName());
}